

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
embree::TutorialBuildBenchmark::registerBuildBenchmark
          (TutorialBuildBenchmark *this,string *name,BuildBenchType buildBenchType,int argc,
          char **argv)

{
  ostream *poVar1;
  undefined4 in_ECX;
  uint in_EDX;
  string *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  BenchState benchState;
  BuildBenchParams p;
  bool attach;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined1 local_88 [12];
  uint local_7c;
  undefined4 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [20];
  BuildBenchType in_stack_ffffffffffffffcc;
  
  if ((*(uint *)(in_RDI + 200) & in_EDX) != 0) {
    if ((*(uint *)(in_RDI + 200) & *(int *)(in_RDI + 200) - 1U) != 0) {
      __rhs = &local_68;
      getBuildBenchTypeString_abi_cxx11_(in_stack_ffffffffffffffcc);
      std::operator+((char *)in_RSI,__rhs);
      std::__cxx11::string::operator+=(in_RSI,local_48);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    _local_7c = CONCAT44((int)((ulong)*(undefined8 *)(in_RDI + 200) >> 0x20),in_EDX);
    poVar1 = std::operator<<((ostream *)&std::cout,"BENCHMARK SCENE: ");
    poVar1 = std::operator<<(poVar1,in_RSI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    (**(code **)(in_RDI + 0xd0))(local_88,in_RDI + 0x90,&local_7c,in_ECX,in_R8);
  }
  return;
}

Assistant:

void TutorialBuildBenchmark::registerBuildBenchmark(std::string name, BuildBenchType buildBenchType, int argc, char** argv)
{
  if (buildParams.buildBenchType & buildBenchType) {
    // attach benchmark name if more than one bit in buildBenchMask is set
    bool attach = (buildParams.buildBenchType & (buildParams.buildBenchType - 1)) != 0;
    if (attach) name += "_" + getBuildBenchTypeString(buildBenchType);
    BuildBenchParams p = buildParams;
    p.buildBenchType = buildBenchType;
#ifdef USE_GOOGLE_BENCHMARK
    if (params.legacy) {
      std::cout << "BENCHMARK SCENE: " << name << std::endl;
      BenchState benchState;
      buildBenchFunc(benchState, params, p, argc, argv);
    }
    else {
      ::benchmark::RegisterBenchmark(name.c_str(), callBuildBenchFunc, argc, argv, params, p, buildBenchFunc)->Unit(::benchmark::TimeUnit::kMillisecond);
    }
#else
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    buildBenchFunc(benchState, params, p, argc, argv);
#endif
  }
}